

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::CCPPass::ReplaceValues(CCPPass *this)

{
  uint32_t id;
  uint32_t after;
  bool bVar1;
  bool bVar2;
  __node_base *p_Var3;
  
  bVar2 = this->original_id_bound_ <
          (((((this->super_MemPass).super_Pass.context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->header_).bound;
  p_Var3 = &(this->values_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    id = (uint32_t)*(size_type *)(p_Var3 + 1);
    after = *(uint32_t *)((long)(p_Var3 + 1) + 4);
    if (id != after && after != 0xffffffff) {
      IRContext::KillNamesAndDecorates((this->super_MemPass).super_Pass.context_,id);
      bVar1 = IRContext::ReplaceAllUsesWith((this->super_MemPass).super_Pass.context_,id,after);
      bVar2 = (bool)(bVar2 | bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool CCPPass::ReplaceValues() {
  // Even if we make no changes to the function's IR, propagation may have
  // created new constants.  Even if those constants cannot be replaced in
  // the IR, the constant definition itself is a change.  To reflect this,
  // we check whether the next ID to be given by the module is different than
  // the original bound ID. If that happens, new instructions were added to the
  // module during propagation.
  //
  // See https://github.com/KhronosGroup/SPIRV-Tools/issues/3636 and
  // https://github.com/KhronosGroup/SPIRV-Tools/issues/3991 for details.
  bool changed_ir = (context()->module()->IdBound() > original_id_bound_);

  for (const auto& it : values_) {
    uint32_t id = it.first;
    uint32_t cst_id = it.second;
    if (!IsVaryingValue(cst_id) && id != cst_id) {
      context()->KillNamesAndDecorates(id);
      changed_ir |= context()->ReplaceAllUsesWith(id, cst_id);
    }
  }

  return changed_ir;
}